

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_const_slang::ast::RandSeqProductionSymbol_*,_std::hash<const_slang::ast::RandSeqProductionSymbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::RandSeqProductionSymbol_*,_std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_std::hash<const_slang::ast::RandSeqProductionSymbol_*>_>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::RandSeqProductionSymbol_*,_std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>_>,_8UL>_>::templated_iterator<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,slang::ast::RandSeqProductionSymbol_const*,std::hash<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::hash<slang::ast::RandSeqProductionSymbol_const*>>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>>
::emplace_new_key<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>
          (sherwood_v3_table<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,slang::ast::RandSeqProductionSymbol_const*,std::hash<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::hash<slang::ast::RandSeqProductionSymbol_const*>>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int> *key)

{
  char cVar1;
  uint uVar2;
  RandSeqProductionSymbol *pRVar3;
  undefined8 uVar4;
  EntryPointer psVar5;
  EntryPointer psVar6;
  EntryPointer psVar7;
  sherwood_v3_table<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,slang::ast::RandSeqProductionSymbol_const*,std::hash<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::hash<slang::ast::RandSeqProductionSymbol_const*>>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>>
  sVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  RandSeqProductionSymbol *pRVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_const_slang::ast::RandSeqProductionSymbol_*,_std::hash<const_slang::ast::RandSeqProductionSymbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::RandSeqProductionSymbol_*,_std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_std::hash<const_slang::ast::RandSeqProductionSymbol_*>_>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::RandSeqProductionSymbol_*,_std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>_>,_8UL>_>::templated_iterator<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>_>,_bool>
  pVar15;
  pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int> local_28;
  
  if ((*(long *)(this + 0x10) != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,slang::ast::RandSeqProductionSymbol_const*,std::hash<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::hash<slang::ast::RandSeqProductionSymbol_const*>>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>>
       )distance_from_desired)) {
    uVar11 = *(long *)(this + 0x20) + 1;
    auVar13._8_4_ = (int)(uVar11 >> 0x20);
    auVar13._0_8_ = uVar11;
    auVar13._12_4_ = 0x45300000;
    lVar9 = *(long *)(this + 0x10) + 1;
    auVar14._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar14._0_8_ = lVar9;
    auVar14._12_4_ = 0x45300000;
    if ((auVar13._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar14._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0))) {
      cVar1 = current_entry->distance_from_desired;
      if (cVar1 < '\0') {
        uVar4 = *(undefined8 *)&key->second;
        (current_entry->field_1).value.first = key->first;
        *(undefined8 *)((long)&current_entry->field_1 + 8) = uVar4;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        pRVar3 = key->first;
        uVar4 = *(undefined8 *)&key->second;
        current_entry->distance_from_desired = distance_from_desired;
        pRVar12 = (current_entry->field_1).value.first;
        (current_entry->field_1).value.first = pRVar3;
        local_28.second = (uint)uVar4;
        uVar10 = (current_entry->field_1).value.second;
        (current_entry->field_1).value.second = local_28.second;
        sVar8 = (sherwood_v3_table<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,slang::ast::RandSeqProductionSymbol_const*,std::hash<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::hash<slang::ast::RandSeqProductionSymbol_const*>>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>>
                 )(cVar1 + '\x01');
        cVar1 = current_entry[1].distance_from_desired;
        local_28._12_4_ = SUB84((ulong)uVar4 >> 0x20,0);
        psVar7 = current_entry + 1;
        psVar6 = current_entry;
        while (psVar5 = psVar7, -1 < cVar1) {
          if (cVar1 < (char)sVar8) {
            psVar5->distance_from_desired = (int8_t)sVar8;
            pRVar3 = (psVar5->field_1).value.first;
            (psVar5->field_1).value.first = pRVar12;
            uVar2 = (psVar5->field_1).value.second;
            (psVar5->field_1).value.second = uVar10;
            sVar8 = (sherwood_v3_table<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,slang::ast::RandSeqProductionSymbol_const*,std::hash<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::hash<slang::ast::RandSeqProductionSymbol_const*>>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>>
                     )(cVar1 + '\x01');
            pRVar12 = pRVar3;
            uVar10 = uVar2;
          }
          else {
            sVar8 = (sherwood_v3_table<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,slang::ast::RandSeqProductionSymbol_const*,std::hash<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::hash<slang::ast::RandSeqProductionSymbol_const*>>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::RandSeqProductionSymbol_const*,std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>,std::equal_to<slang::ast::RandSeqProductionSymbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>,8ul>>
                     )((char)sVar8 + '\x01');
            if (sVar8 == this[0x19]) {
              local_28.first = (current_entry->field_1).value.first;
              (current_entry->field_1).value.first = pRVar12;
              local_28.second = (current_entry->field_1).value.second;
              (current_entry->field_1).value.second = uVar10;
              key = &local_28;
              goto LAB_001d65df;
            }
          }
          psVar7 = psVar5 + 1;
          psVar6 = psVar5;
          cVar1 = psVar5[1].distance_from_desired;
        }
        psVar6[1].field_1.value.first = pRVar12;
        psVar6[1].field_1.value.second = uVar10;
        uVar11 = (ulong)(uint)local_28._12_4_;
        *(undefined4 *)((long)&psVar6[1].field_1 + 0xc) = local_28._12_4_;
        psVar5->distance_from_desired = (int8_t)sVar8;
      }
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
      pVar15._9_7_ = (int7)(uVar11 >> 8);
      pVar15.second = true;
      pVar15.first.current = current_entry;
      return pVar15;
    }
  }
LAB_001d65df:
  sherwood_v3_table<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_const_slang::ast::RandSeqProductionSymbol_*,_std::hash<const_slang::ast::RandSeqProductionSymbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::RandSeqProductionSymbol_*,_std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_std::hash<const_slang::ast::RandSeqProductionSymbol_*>_>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::RandSeqProductionSymbol_*,_std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>_>,_8UL>_>
  ::grow((sherwood_v3_table<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_const_slang::ast::RandSeqProductionSymbol_*,_std::hash<const_slang::ast::RandSeqProductionSymbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::RandSeqProductionSymbol_*,_std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_std::hash<const_slang::ast::RandSeqProductionSymbol_*>_>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::RandSeqProductionSymbol_*,_std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>,_std::equal_to<const_slang::ast::RandSeqProductionSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::RandSeqProductionSymbol_*,_unsigned_int>_>,_8UL>_>
          *)this);
  pVar15 = emplace<std::pair<slang::ast::RandSeqProductionSymbol_const*,unsigned_int>>(this,key);
  return pVar15;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }